

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O0

long duckdb::DateDiffTernaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t,long>
               (string_t part,date_t startdate,date_t enddate,ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  date_t in_ECX;
  date_t in_EDX;
  DatePartSpecifier in_stack_00000037;
  date_t in_stack_00000038;
  date_t in_stack_0000003c;
  idx_t in_stack_ffffffffffffff78;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff80;
  string local_58 [16];
  string_t *in_stack_ffffffffffffffb8;
  int64_t local_8;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDX);
  if ((bVar1) && (bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_ECX), bVar1)) {
    string_t::GetString_abi_cxx11_(in_stack_ffffffffffffffb8);
    duckdb::GetDatePartSpecifier(local_58);
    local_8 = DifferenceDates<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_00000037,in_stack_0000003c,in_stack_00000038);
    std::__cxx11::string::~string(local_58);
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}